

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O3

int __kmp_api_omp_get_num_places_(void)

{
  uint uVar1;
  
  if (__kmp_init_middle == 0) {
    __kmp_middle_initialize();
  }
  uVar1 = 0;
  if (__kmp_affin_mask_size != 0) {
    uVar1 = __kmp_affinity_num_masks;
  }
  return uVar1;
}

Assistant:

int FTN_STDCALL KMP_EXPAND_NAME(FTN_GET_NUM_PLACES)(void) {
#if defined(KMP_STUB) || !KMP_AFFINITY_SUPPORTED
  return 0;
#else
  if (!TCR_4(__kmp_init_middle)) {
    __kmp_middle_initialize();
  }
  if (!KMP_AFFINITY_CAPABLE())
    return 0;
  return __kmp_affinity_num_masks;
#endif
}